

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCommandBuffersTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_0::executeLargePrimaryBufferTest
          (TestStatus *__return_storage_ptr__,Context *context)

{
  VkCommandBuffer_s *pVVar1;
  RefData<vk::Handle<(vk::HandleType)24>_> data;
  RefData<vk::VkCommandBuffer_s_*> data_00;
  RefData<vk::Handle<(vk::HandleType)10>_> data_01;
  RefData<vk::Handle<(vk::HandleType)6>_> data_02;
  bool bVar2;
  VkResult VVar3;
  int iVar4;
  VkDevice device;
  DeviceInterface *vk_00;
  VkQueue pVVar5;
  Unique<vk::Handle<(vk::HandleType)10>_> *this;
  VkCommandBuffer_s **ppVVar6;
  reference pvVar7;
  RefBase<vk::Handle<(vk::HandleType)10>_> *pRVar8;
  Handle<(vk::HandleType)10> *pHVar9;
  Handle<(vk::HandleType)6> *pHVar10;
  allocator<char> local_339;
  string local_338;
  TestStatus local_318;
  allocator<char> local_2e9;
  string local_2e8;
  TestStatus local_2c8;
  deUint64 local_2a0;
  uint local_298;
  undefined1 local_291;
  deUint32 ndx_2;
  undefined8 uStack_288;
  VkSubmitInfo submitInfo;
  RefData<vk::Handle<(vk::HandleType)6>_> local_220;
  undefined1 local_200 [8];
  Unique<vk::Handle<(vk::HandleType)6>_> fence;
  uint local_1d8;
  deUint32 ndx_1;
  RefData<vk::Handle<(vk::HandleType)10>_> local_1b0;
  SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_> local_190;
  uint local_17c;
  undefined1 local_178 [4];
  deUint32 ndx;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>_>_>
  events;
  VkCommandBufferBeginInfo primCmdBufBeginInfo;
  RefData<vk::VkCommandBuffer_s_*> local_120;
  undefined1 local_100 [8];
  Unique<vk::VkCommandBuffer_s_*> primCmdBuf;
  VkCommandBufferAllocateInfo cmdBufParams;
  Move<vk::Handle<(vk::HandleType)24>_> local_b0;
  RefData<vk::Handle<(vk::HandleType)24>_> local_90;
  undefined1 local_70 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  VkCommandPoolCreateInfo cmdPoolParams;
  deUint32 LARGE_BUFFER_SIZE;
  deUint32 queueFamilyIndex;
  VkQueue queue;
  DeviceInterface *vk;
  VkDevice vkDevice;
  Context *context_local;
  TestStatus *testResult;
  
  device = Context::getDevice(context);
  vk_00 = Context::getDeviceInterface(context);
  pVVar5 = Context::getUniversalQueue(context);
  Context::getUniversalQueueFamilyIndex(context);
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator._0_4_ = 0x27;
  ::vk::createCommandPool
            (&local_b0,vk_00,device,
             (VkCommandPoolCreateInfo *)
             &cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator,
             (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_90,(Move *)&local_b0);
  data.deleter.m_deviceIface = local_90.deleter.m_deviceIface;
  data.object.m_internal = local_90.object.m_internal;
  data.deleter.m_device = local_90.deleter.m_device;
  data.deleter.m_allocator = local_90.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_70,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move(&local_b0);
  primCmdBuf.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal._0_4_ = 0x28;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_70);
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&primCmdBufBeginInfo.pInheritanceInfo,vk_00,device,
             (VkCommandBufferAllocateInfo *)
             &primCmdBuf.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_120,(Move *)&primCmdBufBeginInfo.pInheritanceInfo);
  data_00.deleter.m_deviceIface = local_120.deleter.m_deviceIface;
  data_00.object = local_120.object;
  data_00.deleter.m_device = local_120.deleter.m_device;
  data_00.deleter.m_pool.m_internal = local_120.deleter.m_pool.m_internal;
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_100,data_00);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move
            ((Move<vk::VkCommandBuffer_s_*> *)&primCmdBufBeginInfo.pInheritanceInfo);
  events.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x2a;
  primCmdBufBeginInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  primCmdBufBeginInfo._4_4_ = 0;
  primCmdBufBeginInfo.pNext = (void *)0x0;
  primCmdBufBeginInfo.flags = 0;
  primCmdBufBeginInfo._20_4_ = 0;
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>_>_>
  ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>_>_>
            *)local_178);
  for (local_17c = 0; local_17c < 10000; local_17c = local_17c + 1) {
    this = (Unique<vk::Handle<(vk::HandleType)10>_> *)operator_new(0x20);
    ::vk::createEvent((Move<vk::Handle<(vk::HandleType)10>_> *)&ndx_1,vk_00,device,0,
                      (VkAllocationCallbacks *)0x0);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_1b0,(Move *)&ndx_1);
    data_01.deleter.m_deviceIface = local_1b0.deleter.m_deviceIface;
    data_01.object.m_internal = local_1b0.object.m_internal;
    data_01.deleter.m_device = local_1b0.deleter.m_device;
    data_01.deleter.m_allocator = local_1b0.deleter.m_allocator;
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>::Unique(this,data_01);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>::SharedPtr
              (&local_190,this);
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>_>_>
    ::push_back((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>_>_>
                 *)local_178,&local_190);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>::~SharedPtr(&local_190);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)10>_>::~Move
              ((Move<vk::Handle<(vk::HandleType)10>_> *)&ndx_1);
  }
  ppVVar6 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_100);
  VVar3 = (*vk_00->_vptr_DeviceInterface[0x49])
                    (vk_00,*ppVVar6,
                     &events.
                      super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ::vk::checkResult(VVar3,"vk.beginCommandBuffer(*primCmdBuf, &primCmdBufBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x3c2);
  for (local_1d8 = 0; local_1d8 < 10000; local_1d8 = local_1d8 + 1) {
    ppVVar6 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                        ((RefBase<vk::VkCommandBuffer_s_*> *)local_100);
    pVVar1 = *ppVVar6;
    pvVar7 = std::
             vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>_>_>
             ::operator[]((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>_>_>
                           *)local_178,(ulong)local_1d8);
    pRVar8 = &de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>::operator->
                        (pvVar7)->super_RefBase<vk::Handle<(vk::HandleType)10>_>;
    pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)10>_>::get(pRVar8);
    fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)pHVar9->m_internal;
    (*vk_00->_vptr_DeviceInterface[0x6a])
              (vk_00,pVVar1,
               fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator,
               0x10000);
  }
  ppVVar6 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_100);
  VVar3 = (*vk_00->_vptr_DeviceInterface[0x4a])(vk_00,*ppVVar6);
  ::vk::checkResult(VVar3,"vk.endCommandBuffer(*primCmdBuf)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x3ca);
  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&submitInfo.pSignalSemaphores,vk_00,
                    device,0,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_220,(Move *)&submitInfo.pSignalSemaphores)
  ;
  data_02.deleter.m_deviceIface = local_220.deleter.m_deviceIface;
  data_02.object.m_internal = local_220.object.m_internal;
  data_02.deleter.m_device = local_220.deleter.m_device;
  data_02.deleter.m_allocator = local_220.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)6>_> *)local_200,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)6>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)6>_> *)&submitInfo.pSignalSemaphores);
  submitInfo.commandBufferCount = 0;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)0x0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  uStack_288 = 4;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x1;
  submitInfo._40_8_ =
       ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                 ((RefBase<vk::VkCommandBuffer_s_*> *)local_100);
  pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)6>_> *)local_200);
  _ndx_2 = pHVar10->m_internal;
  VVar3 = (*vk_00->_vptr_DeviceInterface[2])(vk_00,pVVar5,1,&uStack_288,_ndx_2);
  ::vk::checkResult(VVar3,"vk.queueSubmit(queue, 1u, &submitInfo, *fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x3dd);
  pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::get
                      ((RefBase<vk::Handle<(vk::HandleType)6>_> *)local_200);
  VVar3 = (*vk_00->_vptr_DeviceInterface[0x16])(vk_00,device,1,pHVar10,0,0xffffffffffffffff);
  ::vk::checkResult(VVar3,"vk.waitForFences(vkDevice, 1, &fence.get(), 0u, INFINITE_TIMEOUT)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x3e0);
  local_291 = 0;
  tcu::TestStatus::incomplete();
  local_298 = 0;
  do {
    if (9999 < local_298) {
LAB_0084717d:
      bVar2 = tcu::TestStatus::isComplete(__return_storage_ptr__);
      if (!bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_338,"All events set correctly.",&local_339);
        tcu::TestStatus::pass(&local_318,&local_338);
        tcu::TestStatus::operator=(__return_storage_ptr__,&local_318);
        tcu::TestStatus::~TestStatus(&local_318);
        std::__cxx11::string::~string((string *)&local_338);
        std::allocator<char>::~allocator(&local_339);
      }
      local_291 = 1;
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>::~Unique
                ((Unique<vk::Handle<(vk::HandleType)6>_> *)local_200);
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>_>_>
      ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>_>_>
                 *)local_178);
      ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
                ((Unique<vk::VkCommandBuffer_s_*> *)local_100);
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
                ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_70);
      return __return_storage_ptr__;
    }
    pvVar7 = std::
             vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>_>_>
             ::operator[]((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>_>_>
                           *)local_178,(ulong)local_298);
    pRVar8 = &de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>::operator->
                        (pvVar7)->super_RefBase<vk::Handle<(vk::HandleType)10>_>;
    pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)10>_>::get(pRVar8);
    local_2a0 = pHVar9->m_internal;
    iVar4 = (*vk_00->_vptr_DeviceInterface[0x1b])(vk_00,device,local_2a0);
    if (iVar4 != 3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2e8,"An event was not set.",&local_2e9);
      tcu::TestStatus::fail(&local_2c8,&local_2e8);
      tcu::TestStatus::operator=(__return_storage_ptr__,&local_2c8);
      tcu::TestStatus::~TestStatus(&local_2c8);
      std::__cxx11::string::~string((string *)&local_2e8);
      std::allocator<char>::~allocator(&local_2e9);
      goto LAB_0084717d;
    }
    local_298 = local_298 + 1;
  } while( true );
}

Assistant:

tcu::TestStatus executeLargePrimaryBufferTest(Context& context)
{
	const VkDevice							vkDevice				= context.getDevice();
	const DeviceInterface&					vk						= context.getDeviceInterface();
	const VkQueue							queue					= context.getUniversalQueue();
	const deUint32							queueFamilyIndex		= context.getUniversalQueueFamilyIndex();
	const deUint32							LARGE_BUFFER_SIZE		= 10000;

	const VkCommandPoolCreateInfo			cmdPoolParams			=
	{
		VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO,					//	VkStructureType				sType;
		DE_NULL,													//	const void*					pNext;
		VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT,			//	VkCommandPoolCreateFlags	flags;
		queueFamilyIndex,											//	deUint32					queueFamilyIndex;
	};
	const Unique<VkCommandPool>				cmdPool					(createCommandPool(vk, vkDevice, &cmdPoolParams));

	// Command buffer
	const VkCommandBufferAllocateInfo		cmdBufParams			=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO,				//	VkStructureType				sType;
		DE_NULL,													//	const void*					pNext;
		*cmdPool,													//	VkCommandPool				pool;
		VK_COMMAND_BUFFER_LEVEL_PRIMARY,							//	VkCommandBufferLevel		level;
		1u,															//	uint32_t					bufferCount;
	};
	const Unique<VkCommandBuffer>			primCmdBuf				(allocateCommandBuffer(vk, vkDevice, &cmdBufParams));
	const VkCommandBufferBeginInfo			primCmdBufBeginInfo		=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,
		DE_NULL,
		0,															// flags
		(const VkCommandBufferInheritanceInfo*)DE_NULL,
	};

	std::vector<VkEventSp>					events;
	for (deUint32 ndx = 0; ndx < LARGE_BUFFER_SIZE; ++ndx)
		events.push_back(VkEventSp(new vk::Unique<VkEvent>(createEvent(vk, vkDevice))));

	// record primary command buffer
	VK_CHECK(vk.beginCommandBuffer(*primCmdBuf, &primCmdBufBeginInfo));
	{
		// set all the events
		for (deUint32 ndx = 0; ndx < LARGE_BUFFER_SIZE; ++ndx)
		{
			vk.cmdSetEvent(*primCmdBuf, events[ndx]->get(), VK_PIPELINE_STAGE_ALL_COMMANDS_BIT);
		}
	}
	VK_CHECK(vk.endCommandBuffer(*primCmdBuf));

	// create fence to wait for execution of queue
	const Unique<VkFence>					fence					(createFence(vk, vkDevice));

	const VkSubmitInfo						submitInfo				=
	{
		VK_STRUCTURE_TYPE_SUBMIT_INFO,								// sType
		DE_NULL,													// pNext
		0u,															// waitSemaphoreCount
		DE_NULL,													// pWaitSemaphores
		(const VkPipelineStageFlags*)DE_NULL,						// pWaitDstStageMask
		1,															// commandBufferCount
		&primCmdBuf.get(),											// pCommandBuffers
		0u,															// signalSemaphoreCount
		DE_NULL,													// pSignalSemaphores
	};

	// Submit the command buffer to the queue
	VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo, *fence));

	// wait for end of execution of queue
	VK_CHECK(vk.waitForFences(vkDevice, 1, &fence.get(), 0u, INFINITE_TIMEOUT));

	// check if the buffer was executed correctly - all events had their status
	// changed
	tcu::TestStatus testResult = tcu::TestStatus::incomplete();

	for (deUint32 ndx = 0; ndx < LARGE_BUFFER_SIZE; ++ndx)
	{
		if (vk.getEventStatus(vkDevice, events[ndx]->get()) != VK_EVENT_SET)
		{
			testResult = tcu::TestStatus::fail("An event was not set.");
			break;
		}
	}

	if (!testResult.isComplete())
		testResult = tcu::TestStatus::pass("All events set correctly.");

	return testResult;
}